

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf_lib.c
# Opt level: O0

char * CONF_get_string(lhash_st_CONF_VALUE *conf,char *group,char *name)

{
  CONF ctmp;
  CONF local_50 [2];
  char *local_20;
  char *local_18;
  lhash_st_CONF_VALUE *local_10;
  char *local_8;
  
  local_20 = name;
  local_18 = group;
  local_10 = conf;
  if (conf == (lhash_st_CONF_VALUE *)0x0) {
    local_8 = NCONF_get_string((CONF *)0x0,group,name);
  }
  else {
    CONF_set_nconf(local_50,conf);
    local_8 = NCONF_get_string(local_50,local_18,local_20);
  }
  return local_8;
}

Assistant:

char *CONF_get_string(LHASH_OF(CONF_VALUE) *conf, const char *group,
                      const char *name)
{
    if (conf == NULL) {
        return NCONF_get_string(NULL, group, name);
    } else {
        CONF ctmp;

        CONF_set_nconf(&ctmp, conf);
        return NCONF_get_string(&ctmp, group, name);
    }
}